

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 *pos,ImU32 col,ImWchar c)

{
  ImDrawList *this_00;
  float *in_RDX;
  ImFont *in_RDI;
  ImWchar in_R8W;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float y;
  float x;
  float scale;
  ImFontGlyph *glyph;
  float local_6c;
  ImDrawList *in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffac;
  ImVec2 *in_stack_ffffffffffffffb0;
  ImVec2 *in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffc0;
  
  this_00 = (ImDrawList *)FindGlyph(in_RDI,in_R8W);
  if ((this_00 != (ImDrawList *)0x0) && (((uint)(this_00->CmdBuffer).Size >> 1 & 1) != 0)) {
    if (in_XMM0_Da < 0.0) {
      local_6c = 1.0;
    }
    else {
      local_6c = in_XMM0_Da / in_RDI->FontSize;
    }
    fVar1 = (float)(int)*in_RDX;
    fVar2 = (float)(int)in_RDX[1];
    ImDrawList::PrimReserve(in_stack_ffffffffffffffa0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffbc,
                   *(float *)&(this_00->CmdBuffer).Data * local_6c + fVar1,
                   *(float *)((long)&(this_00->CmdBuffer).Data + 4) * local_6c + fVar2);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb4,
                   (float)(this_00->IdxBuffer).Size * local_6c + fVar1,
                   (float)(this_00->IdxBuffer).Capacity * local_6c + fVar2);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffac,*(float *)&(this_00->IdxBuffer).Data,
                   *(float *)((long)&(this_00->IdxBuffer).Data + 4));
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,(float)(this_00->VtxBuffer).Size,
                   (float)(this_00->VtxBuffer).Capacity);
    ImDrawList::PrimRectUV
              (this_00,(ImVec2 *)CONCAT44(local_6c,fVar1),
               (ImVec2 *)CONCAT44(fVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0,(ImU32)in_stack_ffffffffffffffac);
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, const ImVec2& pos, ImU32 col, ImWchar c) const
{
    const ImFontGlyph* glyph = FindGlyph(c);
    if (!glyph || !glyph->Visible)
        return;
    if (glyph->Colored)
        col |= ~IM_COL32_A_MASK;
    float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
    float x = IM_FLOOR(pos.x);
    float y = IM_FLOOR(pos.y);
    draw_list->PrimReserve(6, 4);
    draw_list->PrimRectUV(ImVec2(x + glyph->X0 * scale, y + glyph->Y0 * scale), ImVec2(x + glyph->X1 * scale, y + glyph->Y1 * scale), ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
}